

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

Status __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::optimize(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool *interrupt)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  Verbosity VVar2;
  Settings *pSVar3;
  SPxOut *pSVar4;
  Verbosity old_verbosity;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_48;
  double local_38;
  double local_30;
  
  Statistics::clearSolvingData(this->_statistics);
  _invalidateSolution(this);
  pSVar3 = this->_currentSettings;
  if ((pSVar3->_intParamValues[0x11] == 0) ||
     (((pSVar3->_intParamValues[0x11] == 1 && (1e-09 <= pSVar3->_realParamValues[0])) &&
      (1e-09 <= pSVar3->_realParamValues[1])))) {
    psVar1 = &this->_tolerances;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              );
    Tolerances::setFloatingPointFeastol(local_48._M_ptr,this->_currentSettings->_realParamValues[0])
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              );
    Tolerances::setFloatingPointOpttol(local_48._M_ptr,this->_currentSettings->_realParamValues[1]);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              );
    local_30 = Tolerances::floatingPointFeastol(local_48._M_ptr);
    local_38 = _DAT_0054c690;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    if (local_30 < local_38) {
      VVar2 = (this->spxout).m_verbosity;
      if (0 < (int)VVar2) {
        (this->spxout).m_verbosity = WARNING;
        pSVar4 = soplex::operator<<(&this->spxout,
                                    "Cannot call floating-point solver with feasibility tolerance below "
                                   );
        pSVar4 = soplex::operator<<(pSVar4,_DAT_0054c690);
        soplex::operator<<(pSVar4," - relaxing tolerance\n");
        (this->spxout).m_verbosity = VVar2;
      }
      Tolerances::setFloatingPointFeastol
                ((psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 ,_DAT_0054c690);
    }
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              );
    local_30 = Tolerances::floatingPointOpttol(local_48._M_ptr);
    local_38 = _DAT_0054c698;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    if (local_30 < local_38) {
      VVar2 = (this->spxout).m_verbosity;
      if (0 < (int)VVar2) {
        (this->spxout).m_verbosity = WARNING;
        pSVar4 = soplex::operator<<(&this->spxout,
                                    "Cannot call floating-point solver with optimality tolerance below "
                                   );
        pSVar4 = soplex::operator<<(pSVar4,_DAT_0054c698);
        soplex::operator<<(pSVar4," - relaxing tolerance\n");
        (this->spxout).m_verbosity = VVar2;
      }
      Tolerances::setFloatingPointOpttol
                ((psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 ,_DAT_0054c698);
    }
    (this->_solver).solvingForBoosted = false;
    _optimize(this,interrupt);
  }
  else {
    if ((pSVar3->_intParamValues[0xf] != 2) && (pSVar3->_intParamValues[0xf] == 0)) {
      _syncLPRational(this,true);
    }
    _optimizeRational(this,interrupt);
  }
  VVar2 = (this->spxout).m_verbosity;
  if (2 < (int)VVar2) {
    (this->spxout).m_verbosity = INFO1;
    soplex::operator<<(&this->spxout,"\n");
    printShortStatistics(this,(this->spxout).m_streams[3]);
    soplex::operator<<(&this->spxout,"\n");
    (this->spxout).m_verbosity = VVar2;
  }
  return this->_status;
}

Assistant:

typename SPxSolverBase<R>::Status SoPlexBase<R>::optimize(volatile bool* interrupt)
{
   assert(_isConsistent());

   // clear statistics
   _statistics->clearSolvingData();

   // the solution is no longer valid
   _invalidateSolution();

   // decide whether to solve the rational LP with iterative refinement or call the standard floating-point solver
   if(intParam(SoPlexBase<R>::SOLVEMODE) == SOLVEMODE_REAL
         || (intParam(SoPlexBase<R>::SOLVEMODE) == SOLVEMODE_AUTO
             && realParam(SoPlexBase<R>::FEASTOL) >= 1e-9 && realParam(SoPlexBase<R>::OPTTOL) >= 1e-9))
   {
      // the only tolerances used are the ones for the floating-point solver, so set them to the global tolerances
      this->tolerances()->setFloatingPointFeastol(realParam(SoPlexBase<R>::FEASTOL));
      this->tolerances()->setFloatingPointOpttol(realParam(SoPlexBase<R>::OPTTOL));

      // ensure that tolerances are reasonable for the floating-point solver
      // todo: refactor to take into account epsilon value instead
      if(this->tolerances()->floatingPointFeastol() <
            _currentSettings->realParam.lower[SoPlexBase<R>::FPFEASTOL])
      {
         SPX_MSG_WARNING(spxout, spxout <<
                         "Cannot call floating-point solver with feasibility tolerance below "
                         << _currentSettings->realParam.lower[SoPlexBase<R>::FPFEASTOL] << " - relaxing tolerance\n");
         this->_tolerances->setFloatingPointFeastol(
            _currentSettings->realParam.lower[SoPlexBase<R>::FPFEASTOL]);
      }

      if(this->tolerances()->floatingPointOpttol() <
            _currentSettings->realParam.lower[SoPlexBase<R>::FPOPTTOL])
      {
         SPX_MSG_WARNING(spxout, spxout <<
                         "Cannot call floating-point solver with optimality tolerance below "
                         << _currentSettings->realParam.lower[SoPlexBase<R>::FPOPTTOL] << " - relaxing tolerance\n");
         this->_tolerances->setFloatingPointOpttol(
            _currentSettings->realParam.lower[SoPlexBase<R>::FPOPTTOL]);
      }

      _solver.setSolvingForBoosted(false);

      _optimize(interrupt);
#ifdef SOPLEX_DEBUG // this check will remove scaling of the realLP
      _checkBasisScaling();
#endif
   }
   else if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_ONLYREAL)
   {
      _syncLPRational();
      _optimizeRational(interrupt);
   }
   else if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_MANUAL)
   {
#ifdef ENABLE_ADDITIONAL_CHECKS
      assert(areLPsInSync(true, true, false));
#else
      assert(areLPsInSync(true, false, false));
#endif

      _optimizeRational(interrupt);

#ifdef ENABLE_ADDITIONAL_CHECKS
      assert(areLPsInSync(true, true, false));
#else
      assert(areLPsInSync(true, false, false));
#endif
   }
   else
   {
#ifdef ENABLE_ADDITIONAL_CHECKS
      assert(areLPsInSync(true, true, false));
#else
      assert(areLPsInSync(true, false, false));
#endif

      _optimizeRational(interrupt);
   }

   SPX_MSG_INFO1(spxout, spxout << "\n";
                 printShortStatistics(spxout.getStream(SPxOut::INFO1));
                 spxout << "\n");


   return status();
}